

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module *
lys_get_import_module(lys_module *module,char *prefix,int pref_len,char *name,int name_len)

{
  byte bVar1;
  lys_import *plVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  char *pcVar5;
  lys_module *plVar6;
  LY_ERR *pLVar7;
  long lVar8;
  
  if (name != (char *)0x0 && prefix != (char *)0x0) {
    __assert_fail("!prefix || !name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x9e5,
                  "const struct lys_module *lys_get_import_module(const struct lys_module *, const char *, int, const char *, int)"
                 );
  }
  if (pref_len == 0 && prefix != (char *)0x0) {
    sVar4 = strlen(prefix);
    pref_len = (int)sVar4;
  }
  if (name_len == 0 && name != (char *)0x0) {
    sVar4 = strlen(name);
    name_len = (int)sVar4;
  }
  if (module == (lys_module *)0x0) {
    plVar6 = (lys_module *)0x0;
  }
  else {
    plVar6 = module;
    if ((module->field_0x40 & 1) != 0) {
      plVar6 = (lys_module *)module->data;
    }
  }
  sVar4 = (size_t)name_len;
  __n = (size_t)pref_len;
  if (prefix != (char *)0x0) {
    if ((module->field_0x40 & 1) == 0) {
      pcVar5 = plVar6->prefix;
    }
    else {
      pcVar5 = module->prefix;
    }
    iVar3 = strncmp(pcVar5,prefix,__n);
    if ((iVar3 != 0) || (pcVar5[__n] != '\0')) goto LAB_00151ed3;
  }
  if (name == (char *)0x0) {
    return plVar6;
  }
  pcVar5 = plVar6->name;
  iVar3 = strncmp(pcVar5,name,sVar4);
  if ((iVar3 == 0) && (pcVar5[sVar4] == '\0')) {
    return plVar6;
  }
LAB_00151ed3:
  bVar1 = module->imp_size;
  lVar8 = 0;
  do {
    if ((ulong)bVar1 * 0x38 - lVar8 == 0) {
      if (name == (char *)0x0) {
        plVar6 = (lys_module *)0x0;
      }
      else {
        pcVar5 = strndup(name,sVar4);
        if (pcVar5 == (char *)0x0) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EMEM;
          plVar6 = (lys_module *)0x0;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_get_import_module");
        }
        else {
          plVar6 = ly_ctx_get_module(module->ctx,pcVar5,(char *)0x0);
          free(pcVar5);
        }
      }
      return plVar6;
    }
    plVar2 = module->imp;
    if (prefix == (char *)0x0) {
LAB_00151f1f:
      if (name == (char *)0x0) {
LAB_00151f8f:
        return *(lys_module **)(plVar2->rev + lVar8 + -0x10);
      }
      pcVar5 = *(char **)(*(long *)(plVar2->rev + lVar8 + -0x10) + 8);
      iVar3 = strncmp(pcVar5,name,sVar4);
      if ((iVar3 == 0) && (pcVar5[sVar4] == '\0')) goto LAB_00151f8f;
    }
    else {
      pcVar5 = *(char **)(plVar2->rev + lVar8 + -8);
      iVar3 = strncmp(pcVar5,prefix,__n);
      if ((iVar3 == 0) && (pcVar5[__n] == '\0')) goto LAB_00151f1f;
    }
    lVar8 = lVar8 + 0x38;
  } while( true );
}

Assistant:

const struct lys_module *
lys_get_import_module(const struct lys_module *module, const char *prefix, int pref_len, const char *name, int name_len)
{
    const struct lys_module *main_module;
    char *str;
    int i;

    assert(!prefix || !name);

    if (prefix && !pref_len) {
        pref_len = strlen(prefix);
    }
    if (name && !name_len) {
        name_len = strlen(name);
    }

    main_module = lys_main_module(module);

    /* module own prefix, submodule own prefix, (sub)module own name */
    if ((!prefix || (!module->type && !strncmp(main_module->prefix, prefix, pref_len) && !main_module->prefix[pref_len])
                 || (module->type && !strncmp(module->prefix, prefix, pref_len) && !module->prefix[pref_len]))
            && (!name || (!strncmp(main_module->name, name, name_len) && !main_module->name[name_len]))) {
        return main_module;
    }

    /* standard import */
    for (i = 0; i < module->imp_size; ++i) {
        if ((!prefix || (!strncmp(module->imp[i].prefix, prefix, pref_len) && !module->imp[i].prefix[pref_len]))
                && (!name || (!strncmp(module->imp[i].module->name, name, name_len) && !module->imp[i].module->name[name_len]))) {
            return module->imp[i].module;
        }
    }

    /* module required by a foreign grouping, deviation, or submodule */
    if (name) {
        str = strndup(name, name_len);
        if (!str) {
            LOGMEM;
            return NULL;
        }
        main_module = ly_ctx_get_module(module->ctx, str, NULL);
        free(str);
        return main_module;
    }

    return NULL;
}